

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

char * mkvparser::SafeArrayAlloc<char>
                 (unsigned_long_long num_elements,unsigned_long_long element_size)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  
  if ((element_size != 0 && num_elements != 0) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = num_elements,
     element_size <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80000000)) / auVar1,0))) {
    pcVar2 = (char *)operator_new__(element_size * num_elements,(nothrow_t *)&std::nothrow);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

Type* SafeArrayAlloc(unsigned long long num_elements,
                     unsigned long long element_size) {
  if (num_elements == 0 || element_size == 0)
    return NULL;

  const size_t kMaxAllocSize = 0x80000000;  // 2GiB
  const unsigned long long num_bytes = num_elements * element_size;
  if (element_size > (kMaxAllocSize / num_elements))
    return NULL;
  if (num_bytes != static_cast<size_t>(num_bytes))
    return NULL;

  return new (std::nothrow) Type[static_cast<size_t>(num_bytes)];
}